

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# window.c
# Opt level: O3

GLFWwindow *
glfwCreateWindow(int width,int height,char *title,GLFWmonitor *monitor,GLFWwindow *share)

{
  uintptr_t uVar1;
  GLFWbool GVar2;
  int iVar3;
  _GLFWwindow *window;
  _GLFWwindow *handle;
  long lVar4;
  _GLFWlibrary *p_Var5;
  undefined8 *puVar6;
  undefined1 local_e0 [8];
  _GLFWfbconfig fbconfig;
  undefined1 auStack_68 [8];
  _GLFWwndconfig wndconfig;
  
  if (title == (char *)0x0) {
    __assert_fail("title != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kentril0[P]OpenGL_Atmospheric_Scattering/src/libs/glfw/src/window.c"
                  ,0x82,
                  "GLFWwindow *glfwCreateWindow(int, int, const char *, GLFWmonitor *, GLFWwindow *)"
                 );
  }
  if (_glfwInitialized == 0) {
    iVar3 = 0x10001;
  }
  else {
    if (width < 1 || height < 1) {
      _glfwInputError(0x10004,"Invalid window size %ix%i",(ulong)(uint)width,(ulong)(uint)height);
      return (GLFWwindow *)0x0;
    }
    p_Var5 = &_glfw;
    puVar6 = (undefined8 *)local_e0;
    for (lVar4 = 9; lVar4 != 0; lVar4 = lVar4 + -1) {
      *puVar6 = *(undefined8 *)&(p_Var5->hints).framebuffer;
      p_Var5 = (_GLFWlibrary *)&(p_Var5->hints).framebuffer.blueBits;
      puVar6 = puVar6 + 1;
    }
    fbconfig.handle = _glfw.hints.context._0_8_;
    uVar1 = fbconfig.handle;
    wndconfig.title = (char *)_glfw.hints.window._16_8_;
    wndconfig._16_8_ = _glfw.hints.window._24_8_;
    wndconfig._24_8_ = _glfw.hints.window._32_8_;
    wndconfig._32_8_ = _glfw.hints.window._40_8_;
    auStack_68._4_4_ = height;
    auStack_68._0_4_ = width;
    fbconfig.handle = uVar1;
    wndconfig._0_8_ = title;
    if ((share == (GLFWwindow *)0x0) ||
       ((fbconfig.handle._0_4_ = _glfw.hints.context.client, (int)fbconfig.handle != 0 &&
        (*(int *)(share + 0x1f0) != 0)))) {
      GVar2 = _glfwIsValidContextConfig((_GLFWctxconfig *)&fbconfig.handle);
      if (GVar2 != 0) {
        window = (_GLFWwindow *)calloc(1,0x358);
        window->next = _glfw.windowListHead;
        _glfw.windowListHead = window;
        (window->videoMode).width = width;
        (window->videoMode).height = height;
        (window->videoMode).redBits = local_e0._0_4_;
        (window->videoMode).greenBits = local_e0._4_4_;
        (window->videoMode).blueBits = fbconfig.redBits;
        (window->videoMode).refreshRate = _glfw.hints.refreshRate;
        window->monitor = (_GLFWmonitor *)monitor;
        window->resizable = (GLFWbool)wndconfig.title;
        window->decorated = wndconfig.resizable;
        window->autoIconify = wndconfig.decorated;
        window->floating = wndconfig.focused;
        window->cursorMode = 0x34001;
        window->minwidth = -1;
        window->minheight = -1;
        window->maxwidth = -1;
        window->maxheight = -1;
        window->numer = -1;
        window->denom = -1;
        handle = _glfwPlatformGetCurrentContext();
        if ((int)fbconfig.handle != 0) {
          glfwMakeContextCurrent((GLFWwindow *)0x0);
        }
        iVar3 = _glfwPlatformCreateWindow
                          (window,(_GLFWwndconfig *)auStack_68,(_GLFWctxconfig *)&fbconfig.handle,
                           (_GLFWfbconfig *)local_e0);
        if (iVar3 == 0) {
          glfwMakeContextCurrent((GLFWwindow *)handle);
        }
        else {
          if ((int)fbconfig.handle == 0) {
LAB_0012b040:
            if (window->monitor != (_GLFWmonitor *)0x0) {
              return (GLFWwindow *)window;
            }
            if (wndconfig.title._4_4_ == 0) {
              return (GLFWwindow *)window;
            }
            _glfwPlatformShowWindow(window);
            if (wndconfig.visible == 0) {
              return (GLFWwindow *)window;
            }
            _glfwPlatformFocusWindow(window);
            return (GLFWwindow *)window;
          }
          (*(window->context).makeCurrent)(window);
          GVar2 = _glfwRefreshContextAttribs((_GLFWctxconfig *)&fbconfig.handle);
          glfwMakeContextCurrent((GLFWwindow *)handle);
          if (GVar2 != 0) goto LAB_0012b040;
        }
        glfwDestroyWindow((GLFWwindow *)window);
      }
      return (GLFWwindow *)0x0;
    }
    iVar3 = 0x1000a;
  }
  _glfwInputError(iVar3,(char *)0x0);
  return (GLFWwindow *)0x0;
}

Assistant:

GLFWAPI GLFWwindow* glfwCreateWindow(int width, int height,
                                     const char* title,
                                     GLFWmonitor* monitor,
                                     GLFWwindow* share)
{
    _GLFWfbconfig fbconfig;
    _GLFWctxconfig ctxconfig;
    _GLFWwndconfig wndconfig;
    _GLFWwindow* window;
    _GLFWwindow* previous;

    assert(title != NULL);

    _GLFW_REQUIRE_INIT_OR_RETURN(NULL);

    if (width <= 0 || height <= 0)
    {
        _glfwInputError(GLFW_INVALID_VALUE,
                        "Invalid window size %ix%i",
                        width, height);

        return NULL;
    }

    fbconfig  = _glfw.hints.framebuffer;
    ctxconfig = _glfw.hints.context;
    wndconfig = _glfw.hints.window;

    wndconfig.width   = width;
    wndconfig.height  = height;
    wndconfig.title   = title;
    ctxconfig.share   = (_GLFWwindow*) share;

    if (ctxconfig.share)
    {
        if (ctxconfig.client == GLFW_NO_API ||
            ctxconfig.share->context.client == GLFW_NO_API)
        {
            _glfwInputError(GLFW_NO_WINDOW_CONTEXT, NULL);
            return NULL;
        }
    }

    if (!_glfwIsValidContextConfig(&ctxconfig))
        return NULL;

    window = calloc(1, sizeof(_GLFWwindow));
    window->next = _glfw.windowListHead;
    _glfw.windowListHead = window;

    window->videoMode.width       = width;
    window->videoMode.height      = height;
    window->videoMode.redBits     = fbconfig.redBits;
    window->videoMode.greenBits   = fbconfig.greenBits;
    window->videoMode.blueBits    = fbconfig.blueBits;
    window->videoMode.refreshRate = _glfw.hints.refreshRate;

    window->monitor     = (_GLFWmonitor*) monitor;
    window->resizable   = wndconfig.resizable;
    window->decorated   = wndconfig.decorated;
    window->autoIconify = wndconfig.autoIconify;
    window->floating    = wndconfig.floating;
    window->cursorMode  = GLFW_CURSOR_NORMAL;

    window->minwidth    = GLFW_DONT_CARE;
    window->minheight   = GLFW_DONT_CARE;
    window->maxwidth    = GLFW_DONT_CARE;
    window->maxheight   = GLFW_DONT_CARE;
    window->numer       = GLFW_DONT_CARE;
    window->denom       = GLFW_DONT_CARE;

    // Save the currently current context so it can be restored later
    previous = _glfwPlatformGetCurrentContext();
    if (ctxconfig.client != GLFW_NO_API)
        glfwMakeContextCurrent(NULL);

    // Open the actual window and create its context
    if (!_glfwPlatformCreateWindow(window, &wndconfig, &ctxconfig, &fbconfig))
    {
        glfwMakeContextCurrent((GLFWwindow*) previous);
        glfwDestroyWindow((GLFWwindow*) window);
        return NULL;
    }

    if (ctxconfig.client != GLFW_NO_API)
    {
        window->context.makeCurrent(window);

        // Retrieve the actual (as opposed to requested) context attributes
        if (!_glfwRefreshContextAttribs(&ctxconfig))
        {
            glfwMakeContextCurrent((GLFWwindow*) previous);
            glfwDestroyWindow((GLFWwindow*) window);
            return NULL;
        }

        // Restore the previously current context (or NULL)
        glfwMakeContextCurrent((GLFWwindow*) previous);
    }

    if (!window->monitor)
    {
        if (wndconfig.visible)
        {
            _glfwPlatformShowWindow(window);
            if (wndconfig.focused)
                _glfwPlatformFocusWindow(window);
        }
    }

    return (GLFWwindow*) window;
}